

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_deserializer.cpp
# Opt level: O2

void __thiscall
duckdb::BinaryDeserializer::OnPropertyBegin
          (BinaryDeserializer *this,field_id_t field_id,char *param_2)

{
  SerializationException *this_00;
  field_id_t params_1;
  undefined2 extraout_AX;
  undefined2 extraout_var;
  undefined4 extraout_var_00;
  allocator local_41;
  string local_40;
  
  params_1 = NextField(this);
  if (params_1 == field_id) {
    return;
  }
  __cxa_allocate_exception(0x10);
  this_00 = (SerializationException *)CONCAT44(extraout_var_00,CONCAT22(extraout_var,extraout_AX));
  ::std::__cxx11::string::string
            ((string *)&local_40,"Failed to deserialize: field id mismatch, expected: %d, got: %d",
             &local_41);
  SerializationException::SerializationException<unsigned_short,unsigned_short>
            (this_00,&local_40,field_id,params_1);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BinaryDeserializer::OnPropertyBegin(const field_id_t field_id, const char *) {
	auto field = NextField();
	if (field != field_id) {
		throw SerializationException("Failed to deserialize: field id mismatch, expected: %d, got: %d", field_id,
		                             field);
	}
}